

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O1

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
hanabi_learning_env::HanabiGame::Parameters_abi_cxx11_
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,HanabiGame *this)

{
  AgentObservationType AVar1;
  uint uVar2;
  AgentObservationType __val;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string __str_6;
  string __str_5;
  string __str_4;
  string __str_3;
  string __str_2;
  string __str_1;
  string __str;
  string __str_7;
  undefined1 local_383;
  undefined1 local_382;
  undefined1 local_381;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  char *local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  uVar9 = this->num_players_;
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar6 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar8 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001102da;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001102da;
      }
      if (uVar5 < 10000) goto LAB_001102da;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_001102da:
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_380 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)__return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_2b8,(char)uVar8 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_2b8._M_dataplus._M_p + (uVar9 >> 0x1f),uVar8,uVar2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_270,(char (*) [8])0x11b111,&local_2b8);
  uVar9 = this->num_colors_;
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar6 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar8 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00110394;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00110394;
      }
      if (uVar5 < 10000) goto LAB_00110394;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_00110394:
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2d8,(char)uVar8 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_2d8._M_dataplus._M_p + (uVar9 >> 0x1f),uVar8,uVar2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_230,(char (*) [7])"colors",&local_2d8);
  uVar9 = this->num_ranks_;
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar6 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar8 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_0011044d;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_0011044d;
      }
      if (uVar5 < 10000) goto LAB_0011044d;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_0011044d:
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2f8,(char)uVar8 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_2f8._M_dataplus._M_p + (uVar9 >> 0x1f),uVar8,uVar2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1f0,(char (*) [6])0x11b1cf,&local_2f8);
  uVar9 = this->hand_size_;
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar6 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar8 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00110506;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00110506;
      }
      if (uVar5 < 10000) goto LAB_00110506;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_00110506:
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_318,(char)uVar8 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_318._M_dataplus._M_p + (uVar9 >> 0x1f),uVar8,uVar2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1b0,(char (*) [10])"hand_size",&local_318);
  uVar9 = this->max_information_tokens_;
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar6 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar8 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001105bf;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001105bf;
      }
      if (uVar5 < 10000) goto LAB_001105bf;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_001105bf:
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_338,(char)uVar8 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_338._M_dataplus._M_p + (uVar9 >> 0x1f),uVar8,uVar2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[23],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_170,(char (*) [23])"max_information_tokens",&local_338);
  uVar9 = this->max_life_tokens_;
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar6 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar8 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_0011066f;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_0011066f;
      }
      if (uVar5 < 10000) goto LAB_0011066f;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_0011066f:
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_358,(char)uVar8 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_358._M_dataplus._M_p + (uVar9 >> 0x1f),uVar8,uVar2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_130,(char (*) [16])"max_life_tokens",&local_358);
  uVar9 = this->seed_;
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar6 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar8 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00110722;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00110722;
      }
      if (uVar5 < 10000) goto LAB_00110722;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_00110722:
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_378,(char)uVar8 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_378._M_dataplus._M_p + (uVar9 >> 0x1f),uVar8,uVar2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_f0,(char (*) [5])"seed",&local_378);
  local_278 = "false";
  if (this->random_start_player_ != false) {
    local_278 = "true";
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_*,_true>
            (&local_b0,(char (*) [20])"random_start_player",&local_278);
  AVar1 = this->observation_type_;
  __val = -AVar1;
  if (0 < (int)AVar1) {
    __val = AVar1;
  }
  uVar9 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar2 = 4;
    do {
      uVar9 = uVar2;
      uVar8 = (uint)uVar6;
      if (uVar8 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_00110811;
      }
      if (uVar8 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_00110811;
      }
      if (uVar8 < 10000) goto LAB_00110811;
      uVar6 = uVar6 / 10000;
      uVar2 = uVar9 + 4;
    } while (99999 < uVar8);
    uVar9 = uVar9 + 1;
  }
LAB_00110811:
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_298,(char)uVar9 - (char)((int)AVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_298._M_dataplus._M_p + (AVar1 >> 0x1f),uVar9,__val);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_70,(char (*) [17])"observation_type",&local_298);
  p_Var3 = local_380;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            (local_380,&local_270,&stack0xffffffffffffffd0,0,&local_381,&local_382,&local_383);
  lVar7 = -0x240;
  paVar10 = &local_70.second.field_2;
  do {
    if (paVar10 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar10->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar10->_M_local_buf + -0x10));
    }
    if (paVar10->_M_local_buf + -0x20 != *(char **)(paVar10->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar10->_M_local_buf + -0x30));
    }
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar10->_M_local_buf + -0x40);
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  return (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)p_Var3;
}

Assistant:

std::unordered_map<std::string, std::string> HanabiGame::Parameters() const {
  return {{"players", std::to_string(num_players_)},
          {"colors", std::to_string(NumColors())},
          {"ranks", std::to_string(NumRanks())},
          {"hand_size", std::to_string(HandSize())},
          {"max_information_tokens", std::to_string(MaxInformationTokens())},
          {"max_life_tokens", std::to_string(MaxLifeTokens())},
          {"seed", std::to_string(seed_)},
          {"random_start_player", random_start_player_ ? "true" : "false"},
          {"observation_type", std::to_string(observation_type_)}};
}